

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformmenu.h
# Opt level: O2

void __thiscall QPlatformMenuBar::QPlatformMenuBar(QPlatformMenuBar *this)

{
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_00780160;
  return;
}

Assistant:

class Q_GUI_EXPORT QPlatformMenuBar : public QObject
{
Q_OBJECT
public:
    virtual void insertMenu(QPlatformMenu *menu, QPlatformMenu *before) = 0;
    virtual void removeMenu(QPlatformMenu *menu) = 0;
    virtual void syncMenu(QPlatformMenu *menuItem) = 0;
    virtual void handleReparent(QWindow *newParentWindow) = 0;
    virtual QWindow *parentWindow() const { return nullptr; }

    virtual QPlatformMenu *menuForTag(quintptr tag) const = 0;
    virtual QPlatformMenu *createMenu() const;
}